

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

double lyd_dec64_to_double(lyd_node *node)

{
  double dVar1;
  
  if (((node != (lyd_node *)0x0) &&
      ((node->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)) &&
     (*(int *)&node->schema[1].ref == 4)) {
    dVar1 = atof((char *)node->ht);
    return dVar1;
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_dec64_to_double");
  return 0.0;
}

Assistant:

API double
lyd_dec64_to_double(const struct lyd_node *node)
{
    if (!node || !(node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))
            || (((struct lys_node_leaf *)node->schema)->type.base != LY_TYPE_DEC64)) {
        LOGARG;
        return 0;
    }

    return atof(((struct lyd_node_leaf_list *)node)->value_str);
}